

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

MeasureUnit *
icu_63::number::impl::stem_to_object::unit(MeasureUnit *__return_storage_ptr__,StemEnum stem)

{
  MeasureUnit MStack_28;
  
  if (stem == STEM_PERMILLE) {
    NoUnit::permille();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&MStack_28);
  }
  else if (stem == STEM_PERCENT) {
    NoUnit::percent();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&MStack_28);
  }
  else {
    if (stem != STEM_BASE_UNIT) {
      MeasureUnit::MeasureUnit(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    NoUnit::base();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&MStack_28);
  }
  NoUnit::~NoUnit((NoUnit *)&MStack_28);
  return __return_storage_ptr__;
}

Assistant:

MeasureUnit stem_to_object::unit(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_BASE_UNIT:
            // Slicing is okay
            return NoUnit::base(); // NOLINT
        case STEM_PERCENT:
            // Slicing is okay
            return NoUnit::percent(); // NOLINT
        case STEM_PERMILLE:
            // Slicing is okay
            return NoUnit::permille(); // NOLINT
        default:
            U_ASSERT(false);
            return {}; // return a value: silence compiler warning
    }
}